

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  unsigned_short *__src;
  int iVar1;
  unsigned_short *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ImVector<unsigned_short> *local_40;
  
  iVar4 = obj->CurLenW;
  if (iVar4 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                  ,0xe85,
                  "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                 );
  }
  uVar3 = obj->Flags;
  lVar6 = (long)new_text_len;
  iVar1 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar6);
  if ((uVar3 >> 0x12 & 1) == 0) {
    if ((obj->BufCapacityA <= obj->CurLenA + iVar1) || ((obj->TextW).Size <= new_text_len + iVar4))
    {
      return false;
    }
  }
  else {
    iVar5 = (obj->TextW).Size;
    if (iVar5 <= new_text_len + iVar4) {
      if (iVar5 <= iVar4) {
        __assert_fail("text_len < obj->TextW.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xe90,
                      "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                     );
      }
      uVar3 = 0x100;
      if (0x100 < new_text_len) {
        uVar3 = new_text_len;
      }
      if ((uint)(new_text_len * 4) < uVar3) {
        uVar3 = new_text_len * 4;
      }
      iVar5 = 0x21;
      if (7 < new_text_len) {
        iVar5 = uVar3 + 1;
      }
      ImVector<unsigned_short>::resize(&obj->TextW,iVar5 + iVar4);
    }
  }
  local_40 = &obj->TextW;
  puVar2 = (obj->TextW).Data;
  if (iVar4 - pos != 0) {
    __src = puVar2 + pos;
    memmove(__src + lVar6,__src,(long)(iVar4 - pos) * 2);
  }
  memcpy(puVar2 + pos,new_text,lVar6 * 2);
  obj->Edited = true;
  iVar4 = new_text_len + obj->CurLenW;
  obj->CurLenW = iVar4;
  obj->CurLenA = obj->CurLenA + iVar1;
  puVar2 = ImVector<unsigned_short>::operator[](local_40,iVar4);
  *puVar2 = 0;
  return true;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}